

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockArgumentHandler.hpp
# Opt level: O2

size_t __thiscall
ut11::detail::MockArgumentHandler<unsigned_long,std::__cxx11::string,std::__cxx11::string>::
CountCalls<unsigned_long,std::__cxx11::string,std::__cxx11::string>
          (MockArgumentHandler<unsigned_long,std::__cxx11::string,std::__cxx11::string> *this,
          unsigned_long expectations,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expectations_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expectations_2)

{
  type_conflict tVar1;
  MockArgumentHandler<unsigned_long,std::__cxx11::string,std::__cxx11::string> *pMVar2;
  size_t sVar3;
  tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  expectationTuple;
  tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tStack_68;
  
  std::_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,void>
            ((_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string> *)&tStack_68,expectations_1
             ,expectations_2);
  sVar3 = 0;
  pMVar2 = this;
  tStack_68.
  super__Tuple_impl<0UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = expectations;
  while (pMVar2 = *(MockArgumentHandler<unsigned_long,std::__cxx11::string,std::__cxx11::string> **)
                   pMVar2, pMVar2 != this) {
    tVar1 = std::enable_if<(0)<(3),bool>::type_ut11::detail::MockArgumentHandler<unsigned_long,std::
            __cxx11::string,std::__cxx11::string>::MatchTuples<0,3,std::tuple<unsigned_long,std::
            __cxx11::string,std::__cxx11::string>,std::tuple<unsigned_long,std::__cxx11::string,std
            ::__cxx11::string>>((__cxx11 *)this,
                                (tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)(pMVar2 + 0x10),&tStack_68);
    sVar3 = sVar3 + tVar1;
  }
  std::
  _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tStack_68);
  return sVar3;
}

Assistant:

std::size_t CountCalls(Expectations... expectations) const
			{
				static_assert(sizeof...(Expectations) == sizeof...(ARGS), "Expectations and Arguments must match");

				std::size_t counter = 0;

				std::tuple<Expectations...> expectationTuple(expectations...);
				for(const std::tuple<ARGS...>& actual : m_arguments)
				{
					if ( MatchTuples<0, sizeof...(ARGS)>(actual, expectationTuple) )
						++counter;
				}
				return counter;
			}